

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Rc<kj::Refcounted>_> * __thiscall
kj::_::ExceptionOr<kj::Rc<kj::Refcounted>_>::operator=
          (ExceptionOr<kj::Rc<kj::Refcounted>_> *this,ExceptionOr<kj::Rc<kj::Refcounted>_> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::Rc<kj::Refcounted>_>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;